

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
MlmWrap::getCurConnectedClients_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,MlmWrap *this,mlm_client_t *temp)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  allocator local_61;
  zmsg_t *msg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  string curItem;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = __return_storage_ptr__;
  cVar1 = mlm_client_connected(temp);
  if (cVar1 == '\0') {
    iVar2 = -5;
    while( true ) {
      std::__cxx11::string::string((string *)&curItem,(string *)&this->state->endpoint);
      iVar3 = mlm_client_connect(temp,curItem._M_dataplus._M_p,1000,"temp");
      if (-1 < iVar3) break;
      std::__cxx11::string::~string((string *)&curItem);
      iVar2 = iVar2 + 1;
      if (iVar2 == 0) {
        return local_58;
      }
      zclock_sleep(100);
    }
    std::__cxx11::string::~string((string *)&curItem);
    if (iVar3 != 0) {
      return local_58;
    }
  }
  msg = zmsg_new();
  mlm_client_sendtox(temp,"Broker","CLIENTLIST","s",0);
  zmsg_destroy(&msg);
  msg = (zmsg_t *)mlm_client_recv(temp);
  pcVar4 = zmsg_popstr(msg);
  free(pcVar4);
  pcVar4 = zmsg_popstr(msg);
  free(pcVar4);
  pcVar4 = zmsg_popstr(msg);
  while (pcVar4 != (char *)0x0) {
    std::__cxx11::string::string((string *)&curItem,pcVar4,&local_61);
    iVar2 = strcmp(pcVar4,"Broker");
    if ((iVar2 != 0) && (iVar2 = strcmp(pcVar4,"temp"), iVar2 != 0)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_58,&curItem);
    }
    free(pcVar4);
    pcVar4 = zmsg_popstr(msg);
    std::__cxx11::string::~string((string *)&curItem);
  }
  zmsg_destroy(&msg);
  return local_58;
}

Assistant:

std::vector<std::string> MlmWrap::getCurConnectedClients(mlm_client_t *temp) {

    std::vector<std::string> cList; //client list to return
    int rc = 0;

    //put this next part in while loop w/ sleep to constantly try to check until it does
    if(!mlm_client_connected(temp)){
        int tries = 5;
        while((rc = mlm_client_connect(temp, state->getEndpoint().c_str(), 1000, TEMP_NETWORK_ID)) < 0 && --tries){
            zclock_sleep(100);
        }
    }

    if (rc == 0) {
        zmsg_t* msg = zmsg_new();
        rc = mlm_client_sendtox(temp, BROKER_NETWORK_ID, clientlist, "s", NULL);
        zmsg_destroy(&msg);

        msg = mlm_client_recv(temp);
        char *listItem = zmsg_popstr(msg); //pull first string off the msg, it's 'm'
        freen(listItem);
        listItem = zmsg_popstr(msg); //pull second string off the msg, it's 'CLIENTLIST'
        freen(listItem);
        listItem = zmsg_popstr(msg);
        while (listItem != NULL) {
            std::string curItem = listItem;
            if(!(streq(listItem, BROKER_NETWORK_ID) || streq(listItem, TEMP_NETWORK_ID))){
                cList.push_back(curItem);
            }
            freen(listItem);
            listItem = zmsg_popstr(msg);
        }
        zmsg_destroy(&msg);
    }
    else{

    }
    return(cList);
}